

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QPDF.cc
# Opt level: O0

void __thiscall QPDF::stopOnError(QPDF *this,string *message)

{
  QPDFExc *__return_storage_ptr__;
  allocator<char> local_39;
  string local_38;
  string *local_18;
  string *message_local;
  QPDF *this_local;
  
  local_18 = message;
  message_local = (string *)this;
  __return_storage_ptr__ = (QPDFExc *)__cxa_allocate_exception(0x80);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_38,"",&local_39);
  damagedPDF(__return_storage_ptr__,this,&local_38,local_18);
  __cxa_throw(__return_storage_ptr__,&QPDFExc::typeinfo,QPDFExc::~QPDFExc);
}

Assistant:

void
QPDF::stopOnError(std::string const& message)
{
    throw damagedPDF("", message);
}